

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_packet.cxx
# Opt level: O1

void __thiscall xray_re::xr_packet::w_sdir(xr_packet *this,fvector3 *value)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint16_t uVar4;
  float fVar5;
  float local_18;
  float local_14;
  float fStack_10;
  undefined4 local_c;
  
  fVar1 = (value->field_0).field_0.x;
  fVar2 = (value->field_0).field_0.y;
  fVar3 = (value->field_0).field_0.z;
  local_18 = fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2;
  if (1e-07 <= local_18) {
    fVar5 = 1.0 / local_18;
    fStack_10 = fVar2 * fVar5;
    local_14 = fVar1 * fVar5;
    local_c = fVar3 * fVar5;
  }
  else {
    _local_14 = 0;
    local_c = 0.0;
    local_18 = 0.0;
  }
  uVar4 = _vector3<float>::compress((_vector3<float> *)&local_14);
  (*this->_vptr_xr_packet[8])(this,(ulong)uVar4);
  (*this->_vptr_xr_packet[0xd])(local_18,this);
  return;
}

Assistant:

void xr_packet::w_sdir(const fvector3& value)
{
	fvector3 temp;
	float m = value.square_magnitude();
	if (m < 1e-7f) {
		temp.set(0, 0, 0);
		m = 0;
	} else {
		temp.mul(value, 1.f/m);
	}
	w_u16(temp.compress());
	w_float(m);
}